

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::AdjustPartialUncollectedAllocBytes
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep,
          uint expectSweepCount)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  RecyclerSweepManager *this_00;
  uint uVar6;
  undefined8 *in_FS_OFFSET;
  uint oldObjectCount;
  uint allocatedObjectCount;
  uint newObjectExpectSweepCount;
  uint newAllocatedCount;
  ushort currentFreeCount;
  uint allObjectCount;
  uint expectSweepCount_local;
  RecyclerSweep *recyclerSweep_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  uVar1 = this->objectCount;
  uVar2 = this->freeCount;
  if (this->lastFreeCount != uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x49a,"(this->lastFreeCount == currentFreeCount)",
                       "this->lastFreeCount == currentFreeCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar6 = (uint)this->oldFreeCount - (uint)uVar2;
  this->oldFreeCount = uVar2;
  oldObjectCount = expectSweepCount;
  if ((expectSweepCount != 0) &&
     (bVar4 = RecyclerSweep::InPartialCollect(recyclerSweep), oldObjectCount = expectSweepCount,
     !bVar4)) {
    uVar5 = (uint)uVar1 - (uint)uVar2;
    if (uVar5 < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x4a6,"(allocatedObjectCount >= newAllocatedCount)",
                         "allocatedObjectCount >= newAllocatedCount");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (uVar5 - uVar6 < uVar6) {
      oldObjectCount = expectSweepCount;
      if (uVar6 < expectSweepCount) {
        oldObjectCount = uVar6;
      }
    }
    else {
      oldObjectCount = 0;
    }
  }
  if (uVar6 < oldObjectCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4ba,"(newAllocatedCount >= newObjectExpectSweepCount)",
                       "newAllocatedCount >= newObjectExpectSweepCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->lastUncollectedAllocBytes < oldObjectCount * this->objectSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4bb,
                       "(this->lastUncollectedAllocBytes >= newObjectExpectSweepCount * this->objectSize)"
                       ,
                       "this->lastUncollectedAllocBytes >= newObjectExpectSweepCount * this->objectSize"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this_00 = RecyclerSweep::GetManager(recyclerSweep);
  RecyclerSweepManager::SubtractSweepNewObjectAllocBytes
            (this_00,(ulong)(oldObjectCount * this->objectSize));
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::AdjustPartialUncollectedAllocBytes(RecyclerSweep& recyclerSweep, uint const expectSweepCount)
{
    const uint allObjectCount = this->objectCount;
    const ushort currentFreeCount = this->freeCount;
    Assert(this->lastFreeCount == currentFreeCount);

    uint newAllocatedCount = this->oldFreeCount - currentFreeCount;
    this->oldFreeCount = currentFreeCount;

    uint newObjectExpectSweepCount = expectSweepCount;
#if ENABLE_CONCURRENT_GC
    if (expectSweepCount != 0 && !recyclerSweep.InPartialCollect())
    {
        // We don't know which objects that we are going sweep are old and which object are new
        // So just assume one way or the other by the amount of old vs. new object in the block
        const uint allocatedObjectCount = allObjectCount - currentFreeCount;
        Assert(allocatedObjectCount >= newAllocatedCount);
        const uint oldObjectCount = allocatedObjectCount - newAllocatedCount;
        if (oldObjectCount < newAllocatedCount)
        {
            // count all of the swept object as new, but don't exceed the amount we allocated
            if (newObjectExpectSweepCount > newAllocatedCount)
            {
                newObjectExpectSweepCount = newAllocatedCount;
            }
        }
        else
        {
            // count all of the swept object as old
            newObjectExpectSweepCount = 0;
        }
    }
#endif

    // The page can be old, or it is full (where we set lastFreeCount to 0)
    // Otherwise, the newly allocated count must be bigger then the expect sweep count
    Assert(newAllocatedCount >= newObjectExpectSweepCount);
    Assert(this->lastUncollectedAllocBytes >= newObjectExpectSweepCount * this->objectSize);

    recyclerSweep.GetManager()->SubtractSweepNewObjectAllocBytes(newObjectExpectSweepCount * this->objectSize);
}